

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

bool __thiscall ON_OffsetSurfaceFunction::Initialize(ON_OffsetSurfaceFunction *this)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  ON_BumpFunction *pOVar4;
  ON_OffsetSurfaceValue *pOVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  ON_BumpFunction *local_1d0;
  double local_1c8;
  int rank;
  ON_2dPoint p;
  int local_14c;
  int j;
  double *X;
  double *B;
  ON_Matrix M;
  ON_3dVector Dt;
  ON_3dVector Ds;
  ON_3dPoint Pt;
  double dt1;
  double dt0;
  double ds1;
  double ds0;
  ON_OffsetSurfaceValue offset_value;
  ON_BumpFunction *bump;
  double dt;
  double ds;
  double b;
  double a;
  int i;
  undefined1 local_28 [8];
  ON_Workspace ws;
  int count;
  ON_OffsetSurfaceFunction *this_local;
  
  ws.m_pMemBlk._4_4_ = ON_SimpleArray<ON_OffsetSurfaceValue>::Count(&this->m_offset_value);
  if ((((this->m_bValid & 1U) == 0) && (this->m_srf != (ON_Surface *)0x0)) &&
     (0 < ws.m_pMemBlk._4_4_)) {
    ON_Workspace::ON_Workspace((ON_Workspace *)local_28);
    ON_SimpleArray<ON_BumpFunction>::SetCount(&this->m_bumps,0);
    ON_SimpleArray<ON_BumpFunction>::Reserve(&this->m_bumps,(long)ws.m_pMemBlk._4_4_);
    for (a._0_4_ = 0; a._0_4_ < ws.m_pMemBlk._4_4_; a._0_4_ = a._0_4_ + 1) {
      pOVar4 = ON_SimpleArray<ON_BumpFunction>::AppendNew(&this->m_bumps);
      pOVar5 = ON_SimpleArray<ON_OffsetSurfaceValue>::operator[](&this->m_offset_value,a._0_4_);
      dVar9 = pOVar5->m_s;
      dVar1 = pOVar5->m_t;
      dVar10 = pOVar5->m_radius;
      pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x8,0);
      ds1 = dVar9 - *pdVar6;
      pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x8,1);
      dt0 = *pdVar6 - dVar9;
      if ((ds1 != 0.0) || (NAN(ds1))) {
        if ((dt0 == 0.0) && (!NAN(dt0))) {
          dt0 = -ds1;
        }
      }
      else {
        ds1 = -dt0;
      }
      pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x18,0);
      dt1 = dVar1 - *pdVar6;
      pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x18,1);
      Pt.z = *pdVar6 - dVar1;
      if ((dt1 != 0.0) || (NAN(dt1))) {
        if ((Pt.z == 0.0) && (!NAN(Pt.z))) {
          Pt.z = -dt1;
        }
      }
      else {
        dt1 = -Pt.z;
      }
      (pOVar4->m_point).x = dVar9;
      (pOVar4->m_point).y = dVar1;
      pOVar4->m_x0 = (pOVar4->m_point).x;
      pOVar4->m_y0 = (pOVar4->m_point).y;
      pOVar4->m_sx[0] = -1.0 / ds1;
      pOVar4->m_sx[1] = 1.0 / dt0;
      pOVar4->m_sy[0] = -1.0 / dt1;
      pOVar4->m_sy[1] = 1.0 / Pt.z;
      pOVar4->m_type[0] = 5;
      pOVar4->m_type[1] = 5;
      pOVar4->m_a = 1.0;
      if (dVar10 <= 0.0) {
        dVar9 = (pOVar4->m_point).x;
        pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x8,0);
        if ((dVar9 == *pdVar6) && (!NAN(dVar9) && !NAN(*pdVar6))) {
          dVar9 = (pOVar4->m_point).y;
          pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x18,0);
          if ((dVar9 == *pdVar6) && (!NAN(dVar9) && !NAN(*pdVar6))) {
            if (((this->m_bZeroSideDerivative[1] & 1U) == 0) &&
               ((this->m_bZeroSideDerivative[3] & 1U) == 0)) {
              pOVar4->m_type[0] = 1;
              pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x8,1);
              pOVar4->m_x0 = *pdVar6;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x8);
              pOVar4->m_sx[0] = -1.0 / dVar9;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x8);
              pOVar4->m_sx[1] = -1.0 / dVar9;
            }
            if (((this->m_bZeroSideDerivative[0] & 1U) == 0) &&
               ((this->m_bZeroSideDerivative[2] & 1U) == 0)) {
              pOVar4->m_type[1] = 1;
              pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x18,1);
              pOVar4->m_y0 = *pdVar6;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x18);
              pOVar4->m_sy[0] = -1.0 / dVar9;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x18);
              pOVar4->m_sy[1] = -1.0 / dVar9;
            }
            goto LAB_007b38d0;
          }
        }
        dVar9 = (pOVar4->m_point).x;
        pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x8,1);
        if ((dVar9 == *pdVar6) && (!NAN(dVar9) && !NAN(*pdVar6))) {
          dVar9 = (pOVar4->m_point).y;
          pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x18,0);
          if ((dVar9 == *pdVar6) && (!NAN(dVar9) && !NAN(*pdVar6))) {
            if (((this->m_bZeroSideDerivative[1] & 1U) == 0) &&
               ((this->m_bZeroSideDerivative[3] & 1U) == 0)) {
              pOVar4->m_type[0] = 1;
              pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x8,0);
              pOVar4->m_x0 = *pdVar6;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x8);
              pOVar4->m_sx[0] = 1.0 / dVar9;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x8);
              pOVar4->m_sx[1] = 1.0 / dVar9;
            }
            if (((this->m_bZeroSideDerivative[0] & 1U) == 0) &&
               ((this->m_bZeroSideDerivative[2] & 1U) == 0)) {
              pOVar4->m_type[1] = 1;
              pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x18,1);
              pOVar4->m_y0 = *pdVar6;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x18);
              pOVar4->m_sy[0] = -1.0 / dVar9;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x18);
              pOVar4->m_sy[1] = -1.0 / dVar9;
            }
            goto LAB_007b38d0;
          }
        }
        dVar9 = (pOVar4->m_point).x;
        pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x8,1);
        if ((dVar9 == *pdVar6) && (!NAN(dVar9) && !NAN(*pdVar6))) {
          dVar9 = (pOVar4->m_point).y;
          pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x18,1);
          if ((dVar9 == *pdVar6) && (!NAN(dVar9) && !NAN(*pdVar6))) {
            if (((this->m_bZeroSideDerivative[1] & 1U) == 0) &&
               ((this->m_bZeroSideDerivative[3] & 1U) == 0)) {
              pOVar4->m_type[0] = 1;
              pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x8,0);
              pOVar4->m_x0 = *pdVar6;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x8);
              pOVar4->m_sx[0] = 1.0 / dVar9;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x8);
              pOVar4->m_sx[1] = 1.0 / dVar9;
            }
            if (((this->m_bZeroSideDerivative[0] & 1U) == 0) &&
               ((this->m_bZeroSideDerivative[2] & 1U) == 0)) {
              pOVar4->m_type[1] = 1;
              pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x18,0);
              pOVar4->m_y0 = *pdVar6;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x18);
              pOVar4->m_sy[0] = 1.0 / dVar9;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x18);
              pOVar4->m_sy[1] = 1.0 / dVar9;
            }
            goto LAB_007b38d0;
          }
        }
        dVar9 = (pOVar4->m_point).x;
        pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x8,0);
        if ((dVar9 == *pdVar6) && (!NAN(dVar9) && !NAN(*pdVar6))) {
          dVar9 = (pOVar4->m_point).y;
          pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x18,1);
          if ((dVar9 == *pdVar6) && (!NAN(dVar9) && !NAN(*pdVar6))) {
            if (((this->m_bZeroSideDerivative[1] & 1U) == 0) &&
               ((this->m_bZeroSideDerivative[3] & 1U) == 0)) {
              pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x8,1);
              pOVar4->m_x0 = *pdVar6;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x8);
              pOVar4->m_sx[0] = -1.0 / dVar9;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x8);
              pOVar4->m_sx[1] = -1.0 / dVar9;
              pOVar4->m_type[0] = 1;
            }
            if (((this->m_bZeroSideDerivative[0] & 1U) == 0) &&
               ((this->m_bZeroSideDerivative[2] & 1U) == 0)) {
              pdVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x18,0);
              pOVar4->m_y0 = *pdVar6;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x18);
              pOVar4->m_sy[0] = 1.0 / dVar9;
              dVar9 = ON_Interval::Length((ON_Interval *)&this->field_0x18);
              pOVar4->m_sy[1] = 1.0 / dVar9;
              pOVar4->m_type[1] = 1;
            }
          }
        }
      }
      else {
        bVar2 = ON_Surface::Ev1Der(this->m_srf,dVar9,dVar1,(ON_3dPoint *)&Ds.z,(ON_3dVector *)&Dt.z,
                                   (ON_3dVector *)&M.m_cmem,0,(int *)0x0);
        if (bVar2) {
          if (ds1 <= dt0) {
            local_1c8 = dt0;
          }
          else {
            local_1c8 = ds1;
          }
          dt = local_1c8;
          if (dt1 <= Pt.z) {
            local_1d0 = (ON_BumpFunction *)Pt.z;
          }
          else {
            local_1d0 = (ON_BumpFunction *)dt1;
          }
          bump = local_1d0;
          dVar9 = ON_3dVector::Length((ON_3dVector *)&Dt.z);
          if ((2.3283064365386963e-10 < dVar9) && (dVar10 / dVar9 < local_1c8)) {
            dt = dVar10 / dVar9;
          }
          dVar9 = ON_3dVector::Length((ON_3dVector *)&M.m_cmem);
          if ((2.3283064365386963e-10 < dVar9) && (dVar10 / dVar9 < (double)local_1d0)) {
            bump = (ON_BumpFunction *)(dVar10 / dVar9);
          }
          if (((this->m_bZeroSideDerivative[0] & 1U) == 0) || ((double)bump < dt1)) {
            dt1 = (double)bump;
          }
          if (((this->m_bZeroSideDerivative[1] & 1U) == 0) || (dt < dt0)) {
            dt0 = dt;
          }
          if (((this->m_bZeroSideDerivative[2] & 1U) == 0) || ((double)bump < Pt.z)) {
            Pt.z = (double)bump;
          }
          if (((this->m_bZeroSideDerivative[3] & 1U) == 0) || (dt < ds1)) {
            ds1 = dt;
          }
          pOVar4->m_sx[0] = -1.0 / ds1;
          pOVar4->m_sx[1] = 1.0 / dt0;
          pOVar4->m_sy[0] = -1.0 / dt1;
          pOVar4->m_sy[1] = 1.0 / Pt.z;
        }
      }
LAB_007b38d0:
    }
    ON_Matrix::ON_Matrix((ON_Matrix *)&B,ws.m_pMemBlk._4_4_,ws.m_pMemBlk._4_4_);
    pdVar6 = (double *)onmalloc((long)(ws.m_pMemBlk._4_4_ * 2) << 3);
    lVar8 = (long)ws.m_pMemBlk._4_4_;
    for (a._0_4_ = 0; a._0_4_ < ws.m_pMemBlk._4_4_; a._0_4_ = a._0_4_ + 1) {
      pOVar4 = ON_SimpleArray<ON_BumpFunction>::operator[](&this->m_bumps,a._0_4_);
      dVar9 = (pOVar4->m_point).x;
      dVar1 = (pOVar4->m_point).y;
      pOVar5 = ON_SimpleArray<ON_OffsetSurfaceValue>::operator[](&this->m_offset_value,a._0_4_);
      pdVar6[a._0_4_] = pOVar5->m_distance;
      for (local_14c = 0; local_14c < ws.m_pMemBlk._4_4_; local_14c = local_14c + 1) {
        pOVar4 = ON_SimpleArray<ON_BumpFunction>::operator[](&this->m_bumps,local_14c);
        dVar10 = ON_BumpFunction::ValueAt(pOVar4,dVar9,dVar1);
        pdVar7 = ON_Matrix::operator[]((ON_Matrix *)&B,a._0_4_);
        pdVar7[local_14c] = dVar10;
      }
    }
    iVar3 = ON_Matrix::RowReduce((ON_Matrix *)&B,2.3283064365386963e-10,pdVar6,(double *)0x0);
    if ((ws.m_pMemBlk._4_4_ == iVar3) &&
       (bVar2 = ON_Matrix::BackSolve
                          ((ON_Matrix *)&B,2.3283064365386963e-10,ws.m_pMemBlk._4_4_,pdVar6,
                           pdVar6 + lVar8), bVar2)) {
      this->m_bValid = true;
    }
    if ((this->m_bValid & 1U) != 0) {
      for (a._0_4_ = 0; a._0_4_ < ws.m_pMemBlk._4_4_; a._0_4_ = a._0_4_ + 1) {
        dVar9 = (pdVar6 + lVar8)[a._0_4_];
        pOVar4 = ON_SimpleArray<ON_BumpFunction>::operator[](&this->m_bumps,a._0_4_);
        pOVar4->m_a = dVar9;
      }
    }
    onfree(pdVar6);
    ON_Matrix::~ON_Matrix((ON_Matrix *)&B);
    ON_Workspace::~ON_Workspace((ON_Workspace *)local_28);
  }
  return (bool)(this->m_bValid & 1);
}

Assistant:

bool ON_OffsetSurfaceFunction::Initialize()
{
  const int count = m_offset_value.Count();
  if ( !m_bValid && 0 != m_srf && count > 0)
  {
    ON_Workspace ws;
    m_bumps.SetCount(0);
    m_bumps.Reserve(count);
    int i;
    double a,b,ds,dt;
    
    for (i = 0; i < count; i++ )
    {
      ON_BumpFunction& bump = m_bumps.AppendNew();
      ON_OffsetSurfaceValue offset_value = m_offset_value[i];
      double ds0 = offset_value.m_s - m_domain[0][0];
      double ds1 = m_domain[0][1] - offset_value.m_s;
      if ( 0.0 == ds0 )
        ds0 = -ds1;
      else if ( 0.0 == ds1 )
        ds1 = -ds0;
      double dt0 = offset_value.m_t - m_domain[1][0];
      double dt1 = m_domain[1][1] - offset_value.m_t;
      if ( 0.0 == dt0 )
        dt0 = -dt1;
      else if ( 0.0 == dt1 )
        dt1 = -dt0;

      // default is a large cubic bump
      bump.m_point.x = offset_value.m_s;
      bump.m_point.y = offset_value.m_t;
      bump.m_x0 = bump.m_point.x;
      bump.m_y0 = bump.m_point.y;

      bump.m_sx[0] = -1.0/ds0;
      bump.m_sx[1] =  1.0/ds1;
      bump.m_sy[0] = -1.0/dt0;
      bump.m_sy[1] =  1.0/dt1;
      bump.m_type[0] = 5;
      bump.m_type[1] = 5;
      bump.m_a = 1.0;

      if ( offset_value.m_radius > 0.0 )
      {
        // user specified cubic bump size
        ON_3dPoint Pt;
        ON_3dVector Ds, Dt;
        if ( m_srf->Ev1Der(offset_value.m_s,offset_value.m_t,Pt,Ds,Dt) )
        {
          ds = (ds0>ds1) ? ds0 : ds1;
          dt = (dt0>dt1) ? dt0 : dt1;
          a = Ds.Length();
          if ( a > ON_ZERO_TOLERANCE )
          {
            b = offset_value.m_radius/a;
            if ( b < ds )
              ds = b;
          }
          a = Dt.Length();
          if ( a > ON_ZERO_TOLERANCE )
          {
            b = offset_value.m_radius/a;
            if ( b < dt )
              dt = b;
          }
          if ( !m_bZeroSideDerivative[0] || dt < dt0 )
            dt0 = dt;
          if ( !m_bZeroSideDerivative[1] || ds < ds1 )
            ds1 = ds;
          if ( !m_bZeroSideDerivative[2] || dt < dt1 )
            dt1 = dt;
          if ( !m_bZeroSideDerivative[3] || ds < ds0 )
            ds0 = ds;
          bump.m_sx[0] = -1.0/ds0;
          bump.m_sx[1] =  1.0/ds1;
          bump.m_sy[0] = -1.0/dt0;
          bump.m_sy[1] =  1.0/dt1;
        }
      }
      else if ( bump.m_point.x == m_domain[0][0] &&  bump.m_point.y == m_domain[1][0] )
      {
        // SW corner bilinear bump
        if ( !m_bZeroSideDerivative[1] && !m_bZeroSideDerivative[3] )
        {
          bump.m_type[0] = 1;
          bump.m_x0 = m_domain[0][1];
          bump.m_sx[0] = -1.0/m_domain[0].Length();
          bump.m_sx[1] = -1.0/m_domain[0].Length();
        }
        if ( !m_bZeroSideDerivative[0] && !m_bZeroSideDerivative[2] )
        {
          bump.m_type[1] = 1;
          bump.m_y0 = m_domain[1][1];
          bump.m_sy[0] = -1.0/m_domain[1].Length();
          bump.m_sy[1] = -1.0/m_domain[1].Length();
        }
      }
      else if ( bump.m_point.x == m_domain[0][1] &&  bump.m_point.y == m_domain[1][0] )
      {
        // SE corner bilinear bump
        if ( !m_bZeroSideDerivative[1] && !m_bZeroSideDerivative[3] )
        {
          bump.m_type[0] = 1;
          bump.m_x0 = m_domain[0][0];
          bump.m_sx[0] = 1.0/m_domain[0].Length();
          bump.m_sx[1] = 1.0/m_domain[0].Length();
        }
        if ( !m_bZeroSideDerivative[0] && !m_bZeroSideDerivative[2] )
        {
          bump.m_type[1] = 1;
          bump.m_y0 = m_domain[1][1];
          bump.m_sy[0] = -1.0/m_domain[1].Length();
          bump.m_sy[1] = -1.0/m_domain[1].Length();
        }
      }
      else if ( bump.m_point.x == m_domain[0][1] &&  bump.m_point.y == m_domain[1][1] )
      {
        // NE corner bilinear bump
        if ( !m_bZeroSideDerivative[1] && !m_bZeroSideDerivative[3] )
        {
          bump.m_type[0] = 1;
          bump.m_x0 = m_domain[0][0];
          bump.m_sx[0] = 1.0/m_domain[0].Length();
          bump.m_sx[1] = 1.0/m_domain[0].Length();
        }
        if ( !m_bZeroSideDerivative[0] && !m_bZeroSideDerivative[2] )
        {
          bump.m_type[1] = 1;
          bump.m_y0 = m_domain[1][0];
          bump.m_sy[0] = 1.0/m_domain[1].Length();
          bump.m_sy[1] = 1.0/m_domain[1].Length();
        }
      }
      else if ( bump.m_point.x == m_domain[0][0] &&  bump.m_point.y == m_domain[1][1] )
      {
        // NW corner bilinear bump
        if ( !m_bZeroSideDerivative[1] && !m_bZeroSideDerivative[3] )
        {
          bump.m_x0 = m_domain[0][1];
          bump.m_sx[0] = -1.0/m_domain[0].Length();
          bump.m_sx[1] = -1.0/m_domain[0].Length();
          bump.m_type[0] = 1;
        }
        if ( !m_bZeroSideDerivative[0] && !m_bZeroSideDerivative[2] )
        {
          bump.m_y0 = m_domain[1][0];
          bump.m_sy[0] = 1.0/m_domain[1].Length();
          bump.m_sy[1] = 1.0/m_domain[1].Length();
          bump.m_type[1] = 1;
        }
      }
    }


    ON_Matrix M(count,count);
    double* B = (double*)onmalloc(2*count*sizeof(*B));
    double* X = B + count;
    int j;
    for ( i = 0; i < count; i++ ) 
    {
      ON_2dPoint p = m_bumps[i].m_point;
      B[i] = m_offset_value[i].m_distance;
      for ( j = 0; j < count; j++ )
      {
        M[i][j] = m_bumps[j].ValueAt(p.x,p.y);
      }
    }
    int rank = M.RowReduce(ON_ZERO_TOLERANCE,B);
    if ( count == rank )
    {
      if ( M.BackSolve(ON_ZERO_TOLERANCE,count,B,X) )
      {
        m_bValid = true;
      }
    }

    if ( !m_bValid )
    {
#if 0 //defined(TL2_MATRIX_INC_)
      // Have access to SVD - try it
      for ( i = 0; i < count; i++ ) 
      {
        ON_2dPoint p = m_bumps[i].m_point;
        B[i] = m_offset_value[i].m_distance;
        for ( j = 0; j < count; j++ )
        {
          M[i][j] = m_bumps[j].ValueAt(p.x,p.y);
        }
      }
      ON_Matrix U, V;
      double* diagonal = (double*)onmalloc(2*count*sizeof(*diagonal));
      double* inverted_diagonal = diagonal + count;
      if ( TL2_MatrixSVD(M,U,diagonal,V,30) )
      {
        rank = TL2_MatrixSVDInvertDiagonal(count,diagonal,inverted_diagonal);
        if ( rank > 0 )
        {
          if ( TL2_MatrixSVDSolve(U,inverted_diagonal,V,1,B,1,X) )
          {
            m_bValid = true;
          }
        }
      }
#endif
    }

    if ( m_bValid )
    {
      for ( i = 0; i < count; i++ )
      {
        m_bumps[i].m_a = X[i];
      }
    }

    onfree(B);
  }
  return m_bValid;
}